

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

bool __thiscall OSToken::getUserPIN(OSToken *this,ByteString *userPINBlob)

{
  int iVar1;
  ByteString *in;
  OSAttribute local_b0;
  
  if (((this->valid == true) &&
      (iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[10])(), (char)iVar1 != '\0')) &&
     (iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[2])(this->tokenObject,0x8000534d)
     , (char)iVar1 != '\0')) {
    (*(this->tokenObject->super_OSObject)._vptr_OSObject[3])(&local_b0,this->tokenObject,0x8000534d)
    ;
    in = OSAttribute::getByteStringValue(&local_b0);
    ByteString::operator=(userPINBlob,in);
    OSAttribute::~OSAttribute(&local_b0);
    return true;
  }
  return false;
}

Assistant:

bool OSToken::getUserPIN(ByteString& userPINBlob)
{
	if (!valid || !tokenObject->isValid())
	{
		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_USERPIN))
	{
		userPINBlob = tokenObject->getAttribute(CKA_OS_USERPIN).getByteStringValue();

		return true;
	}
	else
	{
		return false;
	}
}